

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# amqp_definitions.c
# Opt level: O0

int target_get_capabilities(TARGET_HANDLE target,AMQP_VALUE *capabilities_value)

{
  int iVar1;
  AMQP_TYPE AVar2;
  AMQP_VALUE pAVar3;
  AMQP_VALUE single_amqp_value;
  char *pcStack_38;
  int get_single_value_result;
  char *capabilities_single_value;
  AMQP_VALUE item_value;
  TARGET_INSTANCE *target_instance;
  uint32_t item_count;
  int result;
  AMQP_VALUE *capabilities_value_local;
  TARGET_HANDLE target_local;
  
  if (target == (TARGET_HANDLE)0x0) {
    target_instance._4_4_ = 0x37ef;
  }
  else {
    item_value = (AMQP_VALUE)target;
    _item_count = capabilities_value;
    capabilities_value_local = &target->composite_value;
    iVar1 = amqpvalue_get_composite_item_count(target->composite_value,(uint32_t *)&target_instance)
    ;
    if (iVar1 == 0) {
      if ((uint)target_instance < 7) {
        target_instance._4_4_ = 0x37fd;
      }
      else {
        capabilities_single_value =
             (char *)amqpvalue_get_composite_item_in_place(*(AMQP_VALUE *)item_value,6);
        if (((AMQP_VALUE)capabilities_single_value == (AMQP_VALUE)0x0) ||
           (AVar2 = amqpvalue_get_type((AMQP_VALUE)capabilities_single_value),
           AVar2 == AMQP_TYPE_NULL)) {
          target_instance._4_4_ = 0x3805;
        }
        else {
          AVar2 = amqpvalue_get_type((AMQP_VALUE)capabilities_single_value);
          if (AVar2 == AMQP_TYPE_ARRAY) {
            memset(&stack0xffffffffffffffc8,0,8);
            single_amqp_value._4_4_ = 1;
          }
          else {
            single_amqp_value._4_4_ =
                 amqpvalue_get_symbol
                           ((AMQP_VALUE)capabilities_single_value,&stack0xffffffffffffffc8);
          }
          AVar2 = amqpvalue_get_type((AMQP_VALUE)capabilities_single_value);
          if (((AVar2 == AMQP_TYPE_ARRAY) &&
              (iVar1 = amqpvalue_get_array((AMQP_VALUE)capabilities_single_value,_item_count),
              iVar1 == 0)) || (single_amqp_value._4_4_ == 0)) {
            AVar2 = amqpvalue_get_type((AMQP_VALUE)capabilities_single_value);
            if (AVar2 == AMQP_TYPE_ARRAY) {
              target_instance._4_4_ = 0;
            }
            else {
              pAVar3 = amqpvalue_create_array();
              *_item_count = pAVar3;
              if (*_item_count == (AMQP_VALUE)0x0) {
                target_instance._4_4_ = 0x3821;
              }
              else {
                pAVar3 = amqpvalue_create_symbol(pcStack_38);
                if (pAVar3 == (AMQP_VALUE)0x0) {
                  target_instance._4_4_ = 0x3828;
                }
                else {
                  iVar1 = amqpvalue_add_array_item(*_item_count,pAVar3);
                  if (iVar1 == 0) {
                    iVar1 = amqpvalue_set_composite_item(*(AMQP_VALUE *)item_value,6,*_item_count);
                    if (iVar1 == 0) {
                      target_instance._4_4_ = 0;
                    }
                    else {
                      target_instance._4_4_ = 0x3834;
                    }
                  }
                  else {
                    target_instance._4_4_ = 0x382e;
                  }
                  amqpvalue_destroy(pAVar3);
                }
                amqpvalue_destroy(*_item_count);
              }
            }
          }
          else {
            target_instance._4_4_ = 0x3818;
          }
        }
      }
    }
    else {
      target_instance._4_4_ = 0x37f7;
    }
  }
  return target_instance._4_4_;
}

Assistant:

int target_get_capabilities(TARGET_HANDLE target, AMQP_VALUE* capabilities_value)
{
    int result;

    if (target == NULL)
    {
        result = MU_FAILURE;
    }
    else
    {
        uint32_t item_count;
        TARGET_INSTANCE* target_instance = (TARGET_INSTANCE*)target;
        if (amqpvalue_get_composite_item_count(target_instance->composite_value, &item_count) != 0)
        {
            result = MU_FAILURE;
        }
        else
        {
            if (item_count <= 6)
            {
                result = MU_FAILURE;
            }
            else
            {
                AMQP_VALUE item_value = amqpvalue_get_composite_item_in_place(target_instance->composite_value, 6);
                if ((item_value == NULL) ||
                    (amqpvalue_get_type(item_value) == AMQP_TYPE_NULL))
                {
                    result = MU_FAILURE;
                }
                else
                {
                    const char* capabilities_single_value;
                    int get_single_value_result;
                    if (amqpvalue_get_type(item_value) != AMQP_TYPE_ARRAY)
                    {
                        get_single_value_result = amqpvalue_get_symbol(item_value, &capabilities_single_value);
                    }
                    else
                    {
                        (void)memset((void*)&capabilities_single_value, 0, sizeof(capabilities_single_value));
                        get_single_value_result = 1;
                    }

                    if (((amqpvalue_get_type(item_value) != AMQP_TYPE_ARRAY) || (amqpvalue_get_array(item_value, capabilities_value) != 0)) &&
                        (get_single_value_result != 0))
                    {
                        result = MU_FAILURE;
                    }
                    else
                    {
                        if (amqpvalue_get_type(item_value) != AMQP_TYPE_ARRAY)
                        {
                            *capabilities_value = amqpvalue_create_array();
                            if (*capabilities_value == NULL)
                            {
                                result = MU_FAILURE;
                            }
                            else
                            {
                                AMQP_VALUE single_amqp_value = amqpvalue_create_symbol(capabilities_single_value);
                                if (single_amqp_value == NULL)
                                {
                                    result = MU_FAILURE;
                                }
                                else
                                {
                                    if (amqpvalue_add_array_item(*capabilities_value, single_amqp_value) != 0)
                                    {
                                        result = MU_FAILURE;
                                    }
                                    else
                                    {
                                        if (amqpvalue_set_composite_item(target_instance->composite_value, 6, *capabilities_value) != 0)
                                        {
                                            result = MU_FAILURE;
                                        }
                                        else
                                        {
                                            result = 0;
                                        }
                                    }

                                    amqpvalue_destroy(single_amqp_value);
                                }
                                amqpvalue_destroy(*capabilities_value);
                            }
                        }
                        else
                        {
                            result = 0;
                        }
                    }
                }
            }
        }
    }

    return result;
}